

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::RadioButton(char *label,bool active)

{
  ImVec2 pos;
  bool bVar1;
  ImGuiWindowTempData *min;
  byte in_SIL;
  float fVar2;
  float rhs;
  float fVar3;
  float pad;
  float check_sz;
  bool pressed;
  bool held;
  bool hovered;
  float radius;
  ImVec2 center;
  ImRect text_bb;
  ImRect total_bb;
  ImRect check_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  ImRect *in_stack_fffffffffffffe80;
  ImVec2 *in_stack_fffffffffffffe88;
  ImDrawList *in_stack_fffffffffffffe90;
  ImVec2 *this;
  ImRect *in_stack_fffffffffffffe98;
  ImGuiButtonFlags flags;
  ImDrawList *centre;
  undefined4 in_stack_fffffffffffffea0;
  ImGuiID in_stack_fffffffffffffea4;
  ImRect *in_stack_fffffffffffffea8;
  ImGuiID in_stack_fffffffffffffeb4;
  ImRect *in_stack_fffffffffffffeb8;
  undefined1 hide_text_after_hash;
  float in_stack_fffffffffffffec0;
  undefined4 uVar4;
  ImDrawList *text;
  float fVar5;
  float in_stack_fffffffffffffed4;
  ImGuiNavHighlightFlags in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  byte local_ba;
  byte local_b9;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImRect local_7c;
  ImRect local_6c;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImRect local_4c;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                  (char *)in_stack_fffffffffffffe98,
                                  (char *)in_stack_fffffffffffffe90);
    local_3c = CalcTextSize((char *)in_stack_fffffffffffffea8,
                            (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe98,0));
    min = &local_20->DC;
    fVar3 = (local_30->FramePadding).y;
    fVar3 = fVar3 + fVar3 + local_3c.y + -1.0;
    ImVec2::ImVec2(&local_5c,fVar3,fVar3);
    local_54 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (ImVec2 *)0x16200b);
    ImRect::ImRect(&local_4c,&min->CursorPos,&local_54);
    ItemSize(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    local_6c.Min = local_4c.Min;
    local_6c.Max = local_4c.Max;
    if (0.0 < local_3c.x) {
      SameLine((float)((ulong)in_stack_fffffffffffffe80 >> 0x20),SUB84(in_stack_fffffffffffffe80,0))
      ;
    }
    ImVec2::ImVec2(&local_8c,0.0,(local_30->FramePadding).y);
    local_84 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (ImVec2 *)0x1620db);
    ImVec2::ImVec2(&local_a4,0.0,(local_30->FramePadding).y);
    local_9c = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (ImVec2 *)0x162134);
    local_94 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (ImVec2 *)0x162152);
    ImRect::ImRect(&local_7c,&local_84,&local_94);
    if (0.0 < local_3c.x) {
      in_stack_fffffffffffffed4 = ImRect::GetWidth(&local_7c);
      fVar3 = ImRect::GetHeight(&local_4c);
      ImVec2::ImVec2(&local_ac,in_stack_fffffffffffffed4,fVar3);
      ItemSize((ImVec2 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      ImRect::Add(&local_6c,&local_7c);
    }
    bVar1 = ItemAdd(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffe98);
    flags = (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (bVar1) {
      ImRect::GetCenter((ImRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      fVar3 = ImRect::GetHeight(&local_4c);
      fVar3 = fVar3 * 0.5;
      bVar1 = ButtonBehavior(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                             (bool *)in_stack_fffffffffffffea8,
                             (bool *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             flags);
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
      if (bVar1) {
        MarkItemEdited(local_34);
      }
      RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (ImGuiID)in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      text = local_20->DrawList;
      if (((local_ba & 1) == 0) || ((local_b9 & 1) == 0)) {
        uVar4 = 7;
        if ((local_b9 & 1) != 0) {
          uVar4 = 8;
        }
      }
      else {
        uVar4 = 9;
      }
      fVar5 = fVar3;
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                  SUB84(in_stack_fffffffffffffe90,0));
      ImDrawList::AddCircleFilled
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),(ImU32)in_stack_fffffffffffffe80,
                 (int)in_stack_fffffffffffffe7c);
      if ((local_11 & 1) != 0) {
        fVar2 = ImRect::GetWidth(&local_4c);
        rhs = ImRect::GetHeight(&local_4c);
        fVar2 = ImMin<float>(fVar2,rhs);
        in_stack_fffffffffffffec0 = ImMax<float>(1.0,(float)(int)(fVar2 / 6.0));
        hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
        in_stack_fffffffffffffec0 = fVar3 - in_stack_fffffffffffffec0;
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                    SUB84(in_stack_fffffffffffffe90,0));
        ImDrawList::AddCircleFilled
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                   (ImU32)in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c);
      }
      if (0.0 < local_30->FrameBorderSize) {
        centre = local_20->DrawList;
        this = (ImVec2 *)&stack0xffffffffffffff2c;
        ImVec2::ImVec2(this,1.0,1.0);
        operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                  (ImVec2 *)0x1624b0);
        GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(fVar3,in_stack_fffffffffffffea0),(ImVec2 *)centre,
                   (float)((ulong)this >> 0x20),(ImU32)this,
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   SUB84(in_stack_fffffffffffffe88,0));
        GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(fVar3,in_stack_fffffffffffffea0),(ImVec2 *)centre,
                   (float)((ulong)this >> 0x20),(ImU32)this,
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   SUB84(in_stack_fffffffffffffe88,0));
      }
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)CONCAT44(in_stack_fffffffffffffed4,fVar5),(char *)text,
                        (char *)CONCAT44(uVar4,in_stack_fffffffffffffec0));
      }
      local_1 = bVar1;
      if (0.0 < local_3c.x) {
        pos.y = in_stack_fffffffffffffed4;
        pos.x = fVar5;
        RenderText(pos,(char *)text,(char *)CONCAT44(uVar4,in_stack_fffffffffffffec0),
                   (bool)hide_text_after_hash);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::RadioButton(const char* label, bool active)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImRect check_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(label_size.y + style.FramePadding.y*2-1, label_size.y + style.FramePadding.y*2-1));
    ItemSize(check_bb, style.FramePadding.y);

    ImRect total_bb = check_bb;
    if (label_size.x > 0)
        SameLine(0, style.ItemInnerSpacing.x);
    const ImRect text_bb(window->DC.CursorPos + ImVec2(0, style.FramePadding.y), window->DC.CursorPos + ImVec2(0, style.FramePadding.y) + label_size);
    if (label_size.x > 0)
    {
        ItemSize(ImVec2(text_bb.GetWidth(), check_bb.GetHeight()), style.FramePadding.y);
        total_bb.Add(text_bb);
    }

    if (!ItemAdd(total_bb, id))
        return false;

    ImVec2 center = check_bb.GetCenter();
    center.x = (float)(int)center.x + 0.5f;
    center.y = (float)(int)center.y + 0.5f;
    const float radius = check_bb.GetHeight() * 0.5f;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
        MarkItemEdited(id);

    RenderNavHighlight(total_bb, id);
    window->DrawList->AddCircleFilled(center, radius, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), 16);
    if (active)
    {
        const float check_sz = ImMin(check_bb.GetWidth(), check_bb.GetHeight());
        const float pad = ImMax(1.0f, (float)(int)(check_sz / 6.0f));
        window->DrawList->AddCircleFilled(center, radius-pad, GetColorU32(ImGuiCol_CheckMark), 16);
    }

    if (style.FrameBorderSize > 0.0f)
    {
        window->DrawList->AddCircle(center+ImVec2(1,1), radius, GetColorU32(ImGuiCol_BorderShadow), 16, style.FrameBorderSize);
        window->DrawList->AddCircle(center, radius, GetColorU32(ImGuiCol_Border), 16, style.FrameBorderSize);
    }

    if (g.LogEnabled)
        LogRenderedText(&text_bb.Min, active ? "(x)" : "( )");
    if (label_size.x > 0.0f)
        RenderText(text_bb.Min, label);

    return pressed;
}